

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_command_line.cpp
# Opt level: O0

void __thiscall
(anonymous_namespace)::ClCommandLine::add<char_const*,char_const*>
          (ClCommandLine *this,string *s,char *strs,char *strs_1)

{
  char *pcVar1;
  allocator local_49;
  string local_48;
  char *local_28;
  char *strs_local_1;
  char *strs_local;
  string *s_local;
  ClCommandLine *this_local;
  
  local_28 = strs_1;
  strs_local_1 = strs;
  strs_local = (char *)s;
  s_local = (string *)this;
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(this + 0x10),s);
  pcVar1 = strs_local_1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_48,pcVar1,&local_49);
  add<char_const*>(this,&local_48,local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  return;
}

Assistant:

void add (std::string const & s, Strs... strs) {
            strings_.push_back (s);
            this->add (strs...);
        }